

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

sexp_conflict
sexp_hash_table_cell
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict ht,sexp_conflict obj,
          sexp_conflict createp)

{
  ulong uVar1;
  uint uVar2;
  sexp_conflict psVar3;
  sexp_conflict psVar4;
  sexp psVar5;
  sexp_conflict psVar6;
  undefined8 uVar7;
  sexp_conflict psVar8;
  int *piVar9;
  ulong uVar10;
  sexp_conflict res;
  sexp_conflict newbuckets;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_98;
  sexp_conflict local_90;
  sexp_conflict local_88;
  sexp_conflict local_80;
  sexp_conflict local_78;
  sexp_conflict local_70;
  ulong local_68;
  ulong local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_98 = (sexp_conflict)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  if (((ulong)ht & 3) == 0) {
    psVar6 = (ht->value).type.name;
    psVar3 = (ht->value).type.slots;
    psVar8 = (ht->value).type.getters;
    local_80 = createp;
    psVar4 = sexp_get_bucket(ctx,psVar6,psVar3,obj);
    local_90 = ht;
    local_98 = sexp_scan_bucket(ctx,*(sexp_conflict *)
                                     ((long)&psVar6->value +
                                     ((ulong)psVar4 & 0xfffffffffffffffe) * 4 + 8),obj,psVar8);
    if (local_98 == (sexp_conflict)0x3e) {
      psVar8 = (sexp_conflict)0x3e;
      if (local_80 != (sexp_conflict)0x3e) {
        local_58.next = (ctx->value).context.saves;
        (ctx->value).context.saves = &local_58;
        uVar10 = (local_90->value).fileno.fd;
        uVar1 = (psVar6->value).stack.length;
        psVar8 = local_90;
        local_88 = obj;
        local_78 = psVar6;
        local_58.var = &local_98;
        if (uVar1 >> 2 < (ulong)(((long)uVar10 >> 1) * 3)) {
          uVar2 = (uint)uVar1;
          local_48.var = &local_70;
          local_70 = (sexp_conflict)0x43e;
          (ctx->value).context.saves = &local_48;
          local_68 = uVar10;
          local_58.var = &local_98;
          local_48.next = &local_58;
          psVar5 = (sexp)sexp_make_vector_op(ctx,0,2,(long)(int)(uVar2 * 2) * 2 + 1,0x23e);
          psVar8 = local_90;
          local_70 = psVar5;
          if ((psVar5 != (sexp)0x0) && ((((ulong)psVar5 & 3) != 0 || (psVar5->tag != 0x13)))) {
            if (0 < (int)uVar2) {
              local_60 = (ulong)(uVar2 & 0x7fffffff);
              uVar10 = 0;
              do {
                for (piVar9 = *(int **)((long)&local_78->value + uVar10 * 8 + 8);
                    (((ulong)piVar9 & 3) == 0 && (*piVar9 == 6)); piVar9 = *(int **)(piVar9 + 4)) {
                  psVar6 = sexp_get_bucket(ctx,local_70,psVar3,
                                           *(sexp_conflict *)(*(long *)(piVar9 + 2) + 8));
                  sexp_push_op(ctx,(long)&psVar5->value + (long)(int)((ulong)psVar6 >> 1) * 8 + 8,
                               *(undefined8 *)(piVar9 + 2));
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != local_60);
            }
            (psVar8->value).type.name = local_70;
          }
          obj = local_88;
          (ctx->value).context.saves = local_48.next;
          psVar6 = (psVar8->value).type.name;
          psVar4 = sexp_get_bucket(ctx,psVar6,psVar3,local_88);
          uVar10 = local_68;
        }
        local_98 = (sexp_conflict)sexp_cons_op(ctx,0,2,obj,local_80);
        uVar7 = sexp_cons_op(ctx,0,2,local_98,
                             *(undefined8 *)
                              ((long)&psVar6->value + ((ulong)psVar4 & 0xfffffffffffffffe) * 4 + 8))
        ;
        *(undefined8 *)((long)&psVar6->value + ((ulong)psVar4 & 0xfffffffffffffffe) * 4 + 8) = uVar7
        ;
        (psVar8->value).type.cpl = (sexp)((uVar10 | 1) + 2);
        (ctx->value).context.saves = local_58.next;
        psVar8 = local_98;
      }
    }
    else {
      psVar8 = (sexp_conflict)(local_98->value).flonum;
    }
    local_98 = psVar8;
    return local_98;
  }
  psVar3 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a Hash-Table",ht);
  return psVar3;
}

Assistant:

sexp sexp_hash_table_cell (sexp ctx, sexp self, sexp_sint_t n, sexp ht, sexp obj, sexp createp) {
  sexp buckets, eq_fn, hash_fn, i;
  sexp_uint_t size;
  sexp_gc_var1(res);
  /* extra check - exact type should be checked by the calling procedure */
  if (! sexp_pointerp(ht))
    return sexp_xtype_exception(ctx, self, "not a Hash-Table", ht);
  buckets = sexp_hash_table_buckets(ht);
  eq_fn = sexp_hash_table_eq_fn(ht);
  hash_fn = sexp_hash_table_hash_fn(ht);
  i = sexp_get_bucket(ctx, buckets, hash_fn, obj);
  res = sexp_scan_bucket(ctx, sexp_vector_ref(buckets, i), obj, eq_fn);
  if (sexp_truep(res)) {
    res = sexp_car(res);
  } else if (sexp_truep(createp)) {
    sexp_gc_preserve1(ctx, res);
    size = sexp_unbox_fixnum(sexp_hash_table_size(ht));
    if (sexp_hash_resize_check(size, sexp_vector_length(buckets))) {
      sexp_regrow_hash_table(ctx, ht, buckets, hash_fn);
      buckets = sexp_hash_table_buckets(ht);
      i = sexp_get_bucket(ctx, buckets, hash_fn, obj);
    }
    res = sexp_cons(ctx, obj, createp);
    sexp_vector_set(buckets, i, sexp_cons(ctx, res, sexp_vector_ref(buckets, i)));
    sexp_hash_table_size(ht) = sexp_make_fixnum(size+1);
    sexp_gc_release1(ctx);
  }
  return res;
}